

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  int iVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  iVar1 = ido * 4;
  iVar7 = ido * 2;
  lVar3 = (long)iVar7;
  lVar13 = (long)ido;
  lVar11 = (long)(l1 * ido);
  pfVar8 = cc;
  pfVar4 = ch;
  iVar9 = 0;
  iVar5 = 0;
  if (0 < l1) {
    iVar9 = l1;
    iVar5 = l1;
  }
  while (iVar9 != 0) {
    fVar16 = pfVar8[lVar3 + -1] + pfVar8[lVar3 + -1];
    fVar17 = pfVar8[lVar3] + pfVar8[lVar3];
    fVar19 = *pfVar8 - pfVar8[lVar3 * 2 + -1];
    fVar18 = *pfVar8 + pfVar8[lVar3 * 2 + -1];
    *pfVar4 = fVar16 + fVar18;
    pfVar4[lVar11] = fVar19 - fVar17;
    pfVar4[lVar11 * 2] = fVar18 - fVar16;
    pfVar4[lVar11 * 3] = fVar19 + fVar17;
    pfVar8 = pfVar8 + iVar1;
    pfVar4 = pfVar4 + lVar13;
    iVar9 = iVar9 + -1;
  }
  if (1 < ido) {
    if (ido != 2) {
      pfVar8 = ch + lVar11;
      pfVar14 = ch + lVar11 * 3;
      pfVar4 = ch + lVar11 * 2;
      iVar2 = 0;
      pfVar6 = ch;
      iVar9 = iVar1;
      for (iVar10 = 0; iVar10 != iVar5; iVar10 = iVar10 + 1) {
        lVar3 = -2;
        for (lVar12 = 2; lVar12 < lVar13; lVar12 = lVar12 + 2) {
          fVar16 = cc[iVar2 + lVar12] + cc[iVar9 + lVar3];
          fVar18 = cc[iVar2 + lVar12] - cc[iVar9 + lVar3];
          fVar23 = cc[iVar7 + lVar12] - cc[iVar7 + lVar3];
          fVar22 = cc[iVar7 + lVar12] + cc[iVar7 + lVar3];
          fVar19 = cc[(long)iVar2 + lVar12 + -1] - cc[(long)iVar9 + lVar3 + -1];
          fVar17 = cc[(long)iVar2 + lVar12 + -1] + cc[(long)iVar9 + lVar3 + -1];
          fVar20 = cc[(long)iVar7 + lVar12 + -1] - cc[(long)iVar7 + lVar3 + -1];
          fVar21 = cc[(long)iVar7 + lVar12 + -1] + cc[(long)iVar7 + lVar3 + -1];
          pfVar6[lVar12 + -1] = fVar17 + fVar21;
          fVar17 = fVar17 - fVar21;
          pfVar6[lVar12] = fVar18 + fVar23;
          fVar18 = fVar18 - fVar23;
          fVar21 = fVar19 - fVar22;
          fVar19 = fVar19 + fVar22;
          fVar22 = fVar16 + fVar20;
          fVar16 = fVar16 - fVar20;
          pfVar8[lVar12 + -1] = wa1[lVar12 + -2] * fVar21 - wa1[lVar12 + -1] * fVar22;
          pfVar8[lVar12] = fVar22 * wa1[lVar12 + -2] + fVar21 * wa1[lVar12 + -1];
          pfVar4[lVar12 + -1] = wa2[lVar12 + -2] * fVar17 - wa2[lVar12 + -1] * fVar18;
          pfVar4[lVar12] = fVar18 * wa2[lVar12 + -2] + fVar17 * wa2[lVar12 + -1];
          pfVar14[lVar12 + -1] = wa3[lVar12 + -2] * fVar19 - wa3[lVar12 + -1] * fVar16;
          pfVar14[lVar12] = fVar16 * wa3[lVar12 + -2] + fVar19 * wa3[lVar12 + -1];
          lVar3 = lVar3 + -2;
        }
        iVar9 = iVar9 + iVar1;
        iVar7 = iVar7 + iVar1;
        iVar2 = iVar2 + iVar1;
        pfVar6 = pfVar6 + lVar13;
        pfVar8 = pfVar8 + lVar13;
        pfVar14 = pfVar14 + lVar13;
        pfVar4 = pfVar4 + lVar13;
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    pfVar8 = ch + (ido + -1);
    pfVar4 = ch + (ido + -1) + lVar11;
    while (bVar15 = iVar5 != 0, iVar5 = iVar5 + -1, bVar15) {
      fVar19 = cc[lVar13] + cc[ido * 3];
      fVar18 = cc[ido * 3] - cc[lVar13];
      fVar17 = cc[lVar13 + -1] - cc[(long)(ido * 3) + -1];
      fVar16 = cc[lVar13 + -1] + cc[(long)(ido * 3) + -1];
      *pfVar8 = fVar16 + fVar16;
      *pfVar4 = (fVar17 - fVar19) * 1.4142135;
      pfVar8[lVar11 * 2] = fVar18 + fVar18;
      pfVar8[lVar11 * 3] = (fVar17 + fVar19) * -1.4142135;
      cc = cc + iVar1;
      pfVar8 = pfVar8 + lVar13;
      pfVar4 = pfVar4 + lVar13;
    }
  }
  return;
}

Assistant:

static void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2,float *wa3){
  static float sqrt2=1.414213562373095f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=0;
  t2=ido<<2;
  t3=0;
  t6=ido<<1;
  for(k=0;k<l1;k++){
    t4=t3+t6;
    t5=t1;
    tr3=cc[t4-1]+cc[t4-1];
    tr4=cc[t4]+cc[t4];
    tr1=cc[t3]-cc[(t4+=t6)-1];
    tr2=cc[t3]+cc[t4-1];
    ch[t5]=tr2+tr3;
    ch[t5+=t0]=tr1-tr4;
    ch[t5+=t0]=tr2-tr3;
    ch[t5+=t0]=tr1+tr4;
    t1+=ido;
    t3+=t2;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  for(k=0;k<l1;k++){
    t5=(t4=(t3=(t2=t1<<2)+t6))+t6;
    t7=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      t3+=2;
      t4-=2;
      t5-=2;
      t7+=2;
      ti1=cc[t2]+cc[t5];
      ti2=cc[t2]-cc[t5];
      ti3=cc[t3]-cc[t4];
      tr4=cc[t3]+cc[t4];
      tr1=cc[t2-1]-cc[t5-1];
      tr2=cc[t2-1]+cc[t5-1];
      ti4=cc[t3-1]-cc[t4-1];
      tr3=cc[t3-1]+cc[t4-1];
      ch[t7-1]=tr2+tr3;
      cr3=tr2-tr3;
      ch[t7]=ti2+ti3;
      ci3=ti2-ti3;
      cr2=tr1-tr4;
      cr4=tr1+tr4;
      ci2=ti1+ti4;
      ci4=ti1-ti4;

      ch[(t8=t7+t0)-1]=wa1[i-2]*cr2-wa1[i-1]*ci2;
      ch[t8]=wa1[i-2]*ci2+wa1[i-1]*cr2;
      ch[(t8+=t0)-1]=wa2[i-2]*cr3-wa2[i-1]*ci3;
      ch[t8]=wa2[i-2]*ci3+wa2[i-1]*cr3;
      ch[(t8+=t0)-1]=wa3[i-2]*cr4-wa3[i-1]*ci4;
      ch[t8]=wa3[i-2]*ci4+wa3[i-1]*cr4;
    }
    t1+=ido;
  }

  if(ido%2 == 1)return;

 L105:

  t1=ido;
  t2=ido<<2;
  t3=ido-1;
  t4=ido+(ido<<1);
  for(k=0;k<l1;k++){
    t5=t3;
    ti1=cc[t1]+cc[t4];
    ti2=cc[t4]-cc[t1];
    tr1=cc[t1-1]-cc[t4-1];
    tr2=cc[t1-1]+cc[t4-1];
    ch[t5]=tr2+tr2;
    ch[t5+=t0]=sqrt2*(tr1-ti1);
    ch[t5+=t0]=ti2+ti2;
    ch[t5+=t0]=-sqrt2*(tr1+ti1);

    t3+=ido;
    t1+=t2;
    t4+=t2;
  }
}